

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this,cmFindBaseDebugState *debug)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  string *psVar5;
  pointer pbVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string tryPath;
  string local_f8;
  string *local_d8;
  cmFindBaseDebugState *local_d0;
  string local_c8;
  pointer local_a8;
  string local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  string local_50;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  pbVar4 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = __return_storage_ptr__;
  local_d0 = debug;
  if (pbVar4 != local_a8) {
    do {
      pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1
          ) {
        local_80.first._M_str = (pbVar6->_M_dataplus)._M_p;
        local_80.first._M_len = pbVar6->_M_string_length;
        local_80.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_60 = (pbVar4->_M_dataplus)._M_p;
        local_68 = pbVar4->_M_string_length;
        local_58 = 0;
        views._M_len = 2;
        views._M_array = &local_80;
        cmCatViews(&local_50,views);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar3 = cmsys::SystemTools::FileExists(&local_f8);
        if (bVar3) {
          psVar5 = &local_f8;
          if (this->IncludeFileInPath == false) {
            psVar5 = pbVar6;
          }
          bVar3 = cmFindBase::Validate(&this->super_cmFindBase,psVar5);
          if (bVar3) {
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            cmFindBaseDebugState::FoundAt(local_d0,&local_f8,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            psVar5 = local_d8;
            bVar3 = this->IncludeFileInPath;
            (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
            if (bVar3 == true) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
                (local_d8->field_2)._M_allocated_capacity =
                     CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                              local_f8.field_2._M_local_buf[0]);
                *(undefined8 *)((long)&local_d8->field_2 + 8) = local_f8.field_2._8_8_;
              }
              else {
                (local_d8->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
                (local_d8->field_2)._M_allocated_capacity =
                     CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                              local_f8.field_2._M_local_buf[0]);
              }
              local_d8->_M_string_length = local_f8._M_string_length;
              local_f8._M_string_length = 0;
              local_f8.field_2._M_local_buf[0] = '\0';
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              pcVar2 = (pbVar6->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_d8,pcVar2,pcVar2 + pbVar6->_M_string_length);
            }
            goto LAB_0037c552;
          }
        }
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        cmFindBaseDebugState::FailedAt(local_d0,&local_f8,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_a8);
  }
  psVar5 = local_d8;
  (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
LAB_0037c552:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return psVar5;
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader(cmFindBaseDebugState& debug)
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = cmStrCat(sp, n);
      if (cmSystemTools::FileExists(tryPath) &&
          this->Validate(this->IncludeFileInPath ? tryPath : sp)) {
        debug.FoundAt(tryPath);
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
      debug.FailedAt(tryPath);
    }
  }
  return "";
}